

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.c
# Opt level: O1

void solver_cancel_until(solver_t *s,uint level)

{
  heap_t *h;
  vec_int_t *pvVar1;
  vec_uint_t *pvVar2;
  int *piVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar9;
  
  if (s->trail_lim->size <= level) {
    return;
  }
  pvVar2 = s->trail_lim;
  if (level < pvVar2->size) {
    uVar6 = s->trail->size;
    do {
      puVar4 = pvVar2->data;
      uVar8 = puVar4[level];
      if (uVar6 <= uVar8) {
        s->i_qhead = uVar8;
        uVar6 = puVar4[level];
        if ((uVar6 <= s->trail->cap) && (s->trail->size = uVar6, level <= pvVar2->cap)) {
          pvVar2->size = level;
          return;
        }
        __assert_fail("p->cap >= new_size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_uint.h"
                      ,0x65,"void vec_uint_shrink(vec_uint_t *, unsigned int)");
      }
      uVar6 = uVar6 - 1;
      if (s->trail->size <= uVar6) break;
      uVar8 = s->trail->data[uVar6] >> 1;
      if (s->assigns->size <= uVar8) {
        __assert_fail("(idx >= 0) && (idx < vec_char_size(p))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_char.h"
                      ,0xb9,"void vec_char_assign(vec_char_t *, unsigned int, char)");
      }
      s->assigns->data[uVar8] = '\x03';
      if (s->reasons->size <= uVar8) {
        __assert_fail("(idx >= 0) && (idx < vec_uint_size(p))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_uint.h"
                      ,0xc2,"void vec_uint_assign(vec_uint_t *, unsigned int, unsigned int)");
      }
      s->reasons->data[uVar8] = 0xffffffff;
      h = s->var_order;
      pvVar1 = h->indices;
      uVar5 = pvVar1->size;
      uVar7 = (ulong)uVar5;
      if (uVar8 < uVar5) {
        if (pvVar1->data[uVar8] < 0) {
          if (uVar5 <= uVar8) goto LAB_008e9e24;
          goto LAB_008e9e76;
        }
      }
      else {
LAB_008e9e24:
        uVar9 = uVar8 + 1;
        pvVar1->size = uVar9;
        if (pvVar1->cap <= uVar8) {
          piVar3 = (int *)realloc(pvVar1->data,(ulong)uVar9 << 2);
          pvVar1->data = piVar3;
          if (piVar3 == (int *)0x0) {
            __assert_fail("p->data != NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_int.h"
                          ,0x5e,"void vec_int_resize(vec_int_t *, unsigned int)");
          }
          pvVar1->cap = uVar9;
        }
        pvVar1 = h->indices;
        if (uVar5 < pvVar1->size) {
          piVar3 = pvVar1->data;
          do {
            piVar3[uVar7] = -1;
            uVar7 = uVar7 + 1;
          } while (uVar7 < pvVar1->size);
        }
LAB_008e9e76:
        pvVar1 = h->indices;
        if ((uVar8 < pvVar1->size) && (-1 < pvVar1->data[uVar8])) {
          __assert_fail("!heap_in_heap(p, entry)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/heap.h"
                        ,0x7f,"void heap_insert(heap_t *, unsigned int)");
        }
        if (pvVar1->size <= uVar8) {
          __assert_fail("(i >= 0) && (i < vec_int_size(p))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_int.h"
                        ,0xa6,"void vec_int_assign(vec_int_t *, unsigned int, int)");
        }
        pvVar2 = h->data;
        pvVar1->data[uVar8] = pvVar2->size;
        uVar5 = pvVar2->cap;
        if (pvVar2->size == uVar5) {
          if (uVar5 < 0x10) {
            puVar4 = (uint *)realloc(pvVar2->data,0x40);
            pvVar2->data = puVar4;
            uVar5 = 0x10;
            if (puVar4 == (uint *)0x0) {
LAB_008ea05f:
              __assert_fail("p->data != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_uint.h"
                            ,0x6e,"void vec_uint_reserve(vec_uint_t *, unsigned int)");
            }
          }
          else {
            if ((int)uVar5 < 1) goto LAB_008e9f07;
            puVar4 = (uint *)realloc(pvVar2->data,(ulong)uVar5 * 8);
            pvVar2->data = puVar4;
            if (puVar4 == (uint *)0x0) goto LAB_008ea05f;
            uVar5 = uVar5 * 2;
          }
          pvVar2->cap = uVar5;
        }
LAB_008e9f07:
        pvVar2->data[pvVar2->size] = uVar8;
        pvVar2->size = pvVar2->size + 1;
        if (h->indices->size <= uVar8) {
          __assert_fail("i >= 0 && i < p->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_int.h"
                        ,0x7e,"int vec_int_at(vec_int_t *, unsigned int)");
        }
        heap_percolate_up(h,h->indices->data[uVar8]);
      }
      pvVar2 = s->trail_lim;
    } while (level < pvVar2->size);
  }
  __assert_fail("idx >= 0 && idx < p->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/satoko/utils/vec/vec_uint.h"
                ,0x85,"unsigned int vec_uint_at(vec_uint_t *, unsigned int)");
}

Assistant:

void solver_cancel_until(solver_t *s, unsigned level)
{
    unsigned i;

    if (solver_dlevel(s) <= level)
        return;
    for (i = vec_uint_size(s->trail); i --> vec_uint_at(s->trail_lim, level);) {
        unsigned var = lit2var(vec_uint_at(s->trail, i));

        vec_char_assign(s->assigns, var, SATOKO_VAR_UNASSING);
        vec_uint_assign(s->reasons, var, UNDEF);
        if (!heap_in_heap(s->var_order, var))
            heap_insert(s->var_order, var);
    }
    s->i_qhead = vec_uint_at(s->trail_lim, level);
    vec_uint_shrink(s->trail, vec_uint_at(s->trail_lim, level));
    vec_uint_shrink(s->trail_lim, level);
}